

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QSet<QTabBar_*> __thiscall QDockAreaLayout::usedTabBars(QDockAreaLayout *this)

{
  long lVar1;
  QDockAreaLayoutInfo *in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo *dock;
  int i;
  QSet<QTabBar_*> *result;
  Hash this_00;
  int local_28;
  QDockAreaLayoutInfo *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&in_RDI->sep = &DAT_aaaaaaaaaaaaaaaa;
  this_00.d = (Data *)in_RDI;
  this_01 = in_RDI;
  QSet<QTabBar_*>::QSet((QSet<QTabBar_*> *)0x57caba);
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    QDockAreaLayoutInfo::usedTabBars(this_01);
    QSet<QTabBar_*>::operator+=((QSet<QTabBar_*> *)this_00.d,(QSet<QTabBar_*> *)in_RDI);
    QSet<QTabBar_*>::~QSet((QSet<QTabBar_*> *)0x57cb19);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QSet<QTabBar_*>)(Hash)this_00.d;
}

Assistant:

QSet<QTabBar*> QDockAreaLayout::usedTabBars() const
{
    QSet<QTabBar*> result;
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &dock = docks[i];
        result += dock.usedTabBars();
    }
    return result;
}